

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prolog.cpp
# Opt level: O0

void __thiscall Goal::solve(Goal *this,Program *prog,int level,VarMapping *vars)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  ulong uVar3;
  Goal *in_RCX;
  int in_EDX;
  EVP_PKEY_CTX *src;
  string *in_RSI;
  char *dst;
  string *this_00;
  undefined8 *in_RDI;
  Goal *gdash;
  Clause *cl;
  Trace *tr;
  Program *iter;
  Clause *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffe8;
  string *psVar4;
  
  indent(0);
  poVar2 = std::operator<<((ostream *)&std::cout,"solve@");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_EDX);
  std::operator<<(poVar2,": ");
  print((Goal *)in_stack_ffffffffffffffb0);
  dst = "\n";
  std::operator<<((ostream *)&std::cout,"\n");
  this_00 = in_RSI;
  for (; in_RSI != (string *)0x0; in_RSI = (string *)in_RSI->_M_string_length) {
    Trace::Note();
    iVar1 = Clause::copy((Clause *)(in_RSI->_M_dataplus)._M_p,(EVP_PKEY_CTX *)dst,src);
    Trace::Undo((Trace *)0x102491);
    indent(0);
    std::operator<<((ostream *)&std::cout,"  try:");
    Clause::print(in_stack_ffffffffffffffb0);
    std::operator<<((ostream *)&std::cout,"\n");
    dst = *(char **)CONCAT44(extraout_var,iVar1);
    uVar3 = (**(code **)(*(long *)*in_RDI + 8))();
    if ((uVar3 & 1) == 0) {
      indent(0);
      dst = "  nomatch.\n";
      std::operator<<((ostream *)&std::cout,"  nomatch.\n");
    }
    else {
      if (((undefined8 *)CONCAT44(extraout_var,iVar1))[1] == 0) {
        in_stack_ffffffffffffffb0 = (Clause *)in_RDI[1];
      }
      else {
        dst = (char *)in_RDI[1];
        in_stack_ffffffffffffffb0 = (Clause *)append(in_RCX,(Goal *)in_RSI);
      }
      if (in_stack_ffffffffffffffb0 == (Clause *)0x0) {
        VarMapping::show_answer((VarMapping *)0x0);
      }
      else {
        psVar4 = this_00;
        solve((Goal *)this_00,(Program *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
              (int)((ulong)in_RCX >> 0x20),(VarMapping *)in_RSI);
        dst = (char *)this_00;
        this_00 = psVar4;
      }
    }
    Trace::Undo((Trace *)0x10257f);
  }
  return;
}

Assistant:

void Goal::solve(Program *prog, int level, VarMapping *vars)
{
    indent(level);
    std::cout << "solve@" << level << ": ";
    this->print();
    std::cout << "\n";

    //
    // Iterate over the clauses of the program.
    //
    for (Program *iter = prog; iter; iter = iter->tail) {
        Trace *tr = Trace::Note();
        Clause *cl = iter->head->copy();
        Trace::Undo(tr);

        indent(level);
        std::cout << "  try:";
        cl->print();
        std::cout << "\n";

        // Match the goal to the clause head.
        if (head->unify(cl->head)) {

            // Matched: extend the goal with the clause body and solve it,
            // with the level incremented.
            Goal *gdash = cl->body ? cl->body->append(tail) : tail;
            if (gdash)
                gdash->solve(prog, level + 1, vars);
            else
                vars->show_answer();
        } else {
            indent(level);
            std::cout << "  nomatch.\n";
        }

        // Reset the variables bound at this iteration.
        Trace::Undo(tr);
    }
}